

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O3

Name wasm::Name::fromInt(size_t i)

{
  bool bVar1;
  size_type *psVar2;
  char cVar3;
  size_t sVar4;
  size_t sVar5;
  char cVar6;
  Name NVar7;
  size_type *local_40;
  string __str;
  
  cVar6 = '\x01';
  if (9 < i) {
    sVar5 = i;
    cVar3 = '\x04';
    do {
      cVar6 = cVar3;
      if (sVar5 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_001518f6;
      }
      if (sVar5 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_001518f6;
      }
      if (sVar5 < 10000) goto LAB_001518f6;
      bVar1 = 99999 < sVar5;
      sVar5 = sVar5 / 10000;
      cVar3 = cVar6 + '\x04';
    } while (bVar1);
    cVar6 = cVar6 + '\x01';
  }
LAB_001518f6:
  local_40 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_40,(uint)__str._M_dataplus._M_p,i);
  psVar2 = local_40;
  sVar4 = strlen((char *)local_40);
  NVar7.super_IString.str = (IString)::wasm::IString::interned(sVar4,psVar2,0);
  if (local_40 != &__str._M_string_length) {
    operator_delete(local_40,__str._M_string_length + 1);
  }
  return (Name)NVar7.super_IString.str;
}

Assistant:

static Name fromInt(size_t i) {
    return IString(std::to_string(i).c_str(), false);
  }